

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O1

bool duckdb::MultiFileFunction<duckdb::CSVMultiFileInfo>::TryInitializeNextBatch
               (ClientContext *context,MultiFileBindData *bind_data,MultiFileLocalState *scan_data,
               MultiFileGlobalState *gstate)

{
  unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
  *this;
  idx_t iVar1;
  __int_type _Var2;
  __int_type _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar4;
  bool bVar5;
  reference this_01;
  type reader_data;
  type pGVar6;
  type pLVar7;
  type reader;
  InternalException *this_02;
  unique_lock<std::mutex> parallel_lock;
  unique_lock<std::mutex> local_70;
  vector<unsigned_long,_true> *local_60;
  MultiFileBindData *local_58;
  string local_50;
  
  local_70._M_device = &gstate->lock;
  local_70._M_owns = false;
  local_58 = bind_data;
  ::std::unique_lock<std::mutex>::lock(&local_70);
  local_70._M_owns = true;
  if (gstate->error_opening_file == false) {
    this = &gstate->global_state;
    local_60 = &gstate->projection_ids;
    do {
      if (((ulong)((long)(gstate->readers).
                         super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(gstate->readers).
                         super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) <=
           (gstate->file_index).super___atomic_base<unsigned_long>._M_i) &&
         (bVar4 = TryGetNextFile(gstate,&local_70), !bVar4)) {
        pGVar6 = unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
                 ::operator*(this);
        pLVar7 = unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
                 ::operator*(&scan_data->local_state);
        CSVMultiFileInfo::FinishReading(context,pGVar6,pLVar7);
        break;
      }
      this_01 = vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
                ::operator[](&gstate->readers,
                             (gstate->file_index).super___atomic_base<unsigned_long>._M_i);
      reader_data = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                    ::operator*(this_01);
      if (reader_data->file_state == SKIPPED) {
        LOCK();
        (gstate->file_index).super___atomic_base<unsigned_long>._M_i =
             (gstate->file_index).super___atomic_base<unsigned_long>._M_i + 1;
        UNLOCK();
        bVar4 = false;
      }
      else if (reader_data->file_state == OPEN) {
        pGVar6 = unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
                 ::operator*(this);
        pLVar7 = unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
                 ::operator*(&scan_data->local_state);
        bVar4 = CSVMultiFileInfo::TryInitializeScan(context,&reader_data->reader,pGVar6,pLVar7);
        if (bVar4) {
          if ((reader_data->reader).internal.
              super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            this_02 = (InternalException *)__cxa_allocate_exception(0x10);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"MultiFileReader was moved","");
            InternalException::InternalException(this_02,&local_50);
            __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          iVar1 = gstate->batch_index;
          gstate->batch_index = iVar1 + 1;
          scan_data->batch_index = iVar1;
          _Var2 = scan_data->file_index;
          _Var3 = (gstate->file_index).super___atomic_base<unsigned_long>._M_i;
          scan_data->file_index = _Var3;
          bVar4 = true;
          if (_Var2 != _Var3) {
            InitializeFileScanState(context,reader_data,scan_data,local_60);
          }
        }
        else {
          LOCK();
          (gstate->file_index).super___atomic_base<unsigned_long>._M_i =
               (gstate->file_index).super___atomic_base<unsigned_long>._M_i + 1;
          UNLOCK();
          reader_data->file_state = CLOSED;
          pGVar6 = unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
                   ::operator*(this);
          reader = shared_ptr<duckdb::BaseFileReader,_true>::operator*(&reader_data->reader);
          CSVMultiFileInfo::FinishFile(context,pGVar6,reader);
          (reader_data->closed_reader).internal.
          super___weak_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (reader_data->reader).internal.
               super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(reader_data->closed_reader).internal.
                      super___weak_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(reader_data->reader).internal.
                      super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          this_00 = (reader_data->reader).internal.
                    super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (reader_data->reader).internal.
          super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (reader_data->reader).internal.
          super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          bVar4 = false;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
      }
      else {
        bVar5 = TryOpenNextFile(context,local_58,scan_data,gstate,&local_70);
        bVar4 = false;
        if ((!bVar5) && (bVar4 = false, reader_data->file_state == OPENING)) {
          WaitForFile((gstate->file_index).super___atomic_base<unsigned_long>._M_i,gstate,&local_70)
          ;
        }
      }
      if (bVar4) {
        bVar4 = true;
        goto LAB_015793e2;
      }
    } while (gstate->error_opening_file != true);
  }
  bVar4 = false;
LAB_015793e2:
  ::std::unique_lock<std::mutex>::~unique_lock(&local_70);
  return bVar4;
}

Assistant:

static bool TryInitializeNextBatch(ClientContext &context, const MultiFileBindData &bind_data,
	                                   MultiFileLocalState &scan_data, MultiFileGlobalState &gstate) {
		unique_lock<mutex> parallel_lock(gstate.lock);

		while (true) {
			if (gstate.error_opening_file) {
				return false;
			}

			//! If we don't have a file to read, and the MultiFileList has no new file for us - end the scan
			if (!HasFilesToRead(gstate, parallel_lock) && !TryGetNextFile(gstate, parallel_lock)) {
				OP::FinishReading(context, *gstate.global_state, *scan_data.local_state);
				return false;
			}

			auto &current_reader_data = *gstate.readers[gstate.file_index];
			if (current_reader_data.file_state == MultiFileFileState::OPEN) {
				if (OP::TryInitializeScan(context, current_reader_data.reader, *gstate.global_state,
				                          *scan_data.local_state)) {
					if (!current_reader_data.reader) {
						throw InternalException("MultiFileReader was moved");
					}
					// The current reader has data left to be scanned
					scan_data.batch_index = gstate.batch_index++;
					auto old_file_index = scan_data.file_index;
					scan_data.file_index = gstate.file_index;
					if (old_file_index != scan_data.file_index) {
						InitializeFileScanState(context, current_reader_data, scan_data, gstate.projection_ids);
					}
					return true;
				} else {
					// Set state to the next file
					++gstate.file_index;

					// Close current file
					current_reader_data.file_state = MultiFileFileState::CLOSED;

					//! Finish processing the file
					OP::FinishFile(context, *gstate.global_state, *current_reader_data.reader);
					current_reader_data.closed_reader = current_reader_data.reader;
					current_reader_data.reader = nullptr;
					continue;
				}
			} else if (current_reader_data.file_state == MultiFileFileState::SKIPPED) {
				//! This file does not need to be opened or closed, the filters have determined that this file can be
				//! skipped entirely
				++gstate.file_index;
				continue;
			}

			if (TryOpenNextFile(context, bind_data, scan_data, gstate, parallel_lock)) {
				continue;
			}

			// Check if the current file is being opened, in that case we need to wait for it.
			if (current_reader_data.file_state == MultiFileFileState::OPENING) {
				WaitForFile(gstate.file_index, gstate, parallel_lock);
			}
		}
	}